

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContextTlsEntry.cpp
# Opt level: O3

bool ThreadContextTLSEntry::ClearThreadContext
               (ThreadContextTLSEntry *entry,bool isThreadContextValid,bool force)

{
  ThreadContext *this;
  
  if (entry != (ThreadContextTLSEntry *)0x0) {
    this = entry->threadContext;
    if (isThreadContextValid && this != (ThreadContext *)0x0) {
      if ((!force) && ((this->isThreadBound != false || (this->callRootLevel != 0)))) {
        return false;
      }
      this->currentThreadId = 0xffffffff;
      ThreadContext::SetStackProber(this,(StackProber *)0x0);
    }
    entry->threadContext = (ThreadContext *)0x0;
  }
  return true;
}

Assistant:

bool ThreadContextTLSEntry::ClearThreadContext(ThreadContextTLSEntry * entry, bool isThreadContextValid, bool force)
{
    ASSERT_ENTRY_INITIALIZED();

    if (entry != NULL)
    {
        if (entry->threadContext != NULL && isThreadContextValid)
        {
            // If the thread has an active thread context and either that thread context is thread
            // bound (in which case it cannot be moved off this thread), or if the thread context
            // is running script, you cannot move it off this thread.
            if (!force && (entry->threadContext->IsThreadBound() || entry->threadContext->IsInScript()))
            {
                return false;
            }
            entry->threadContext->SetCurrentThreadId(ThreadContext::NoThread);
            entry->threadContext->SetStackProber(NULL);
        }

        entry->threadContext = NULL;
    }

    return true;
}